

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

FastString __thiscall Strings::quotedPrintable(Strings *this,FastString *textToQuote)

{
  uchar *puVar1;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar2;
  long lVar3;
  FastString FVar4;
  QuotedEncoding enc;
  QuotedEncoding local_38;
  
  Bstrlib::String::String((String *)this);
  local_38.lineLength = 0;
  local_38.lastOne = -1;
  puVar2 = extraout_RDX;
  if (0 < (textToQuote->super_tagbstring).slen) {
    puVar1 = (textToQuote->super_tagbstring).data;
    lVar3 = 0;
    local_38.out = (FastString *)this;
    do {
      QuotedEncoding::quoteChar(&local_38,puVar1[lVar3]);
      lVar3 = lVar3 + 1;
      puVar2 = extraout_RDX_00;
    } while (lVar3 < (textToQuote->super_tagbstring).slen);
  }
  FVar4.super_tagbstring.data = puVar2;
  FVar4.super_tagbstring._0_8_ = this;
  return (FastString)FVar4.super_tagbstring;
}

Assistant:

FastString quotedPrintable(const FastString & textToQuote)
    {
        FastString out; QuotedEncoding enc(out);
        const char * text = (const char *)textToQuote;
        for (int i = 0; i < textToQuote.getLength(); i++)
            enc.quoteChar(text[i]);
        return out;
    }